

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param_test_tests2.cpp
# Opt level: O2

void __thiscall
iu_TypeConversionParamTest_x_iutest_x_Test_Test::iu_TypeConversionParamTest_x_iutest_x_Test_Test
          (iu_TypeConversionParamTest_x_iutest_x_Test_Test *this)

{
  TypeConversionParamTest::TypeConversionParamTest(&this->super_type);
  (this->super_type).super_TestWithParam<double>.super_Test._vptr_Test =
       (_func_int **)&PTR__TestWithParam_00390560;
  (this->super_type).super_TestWithParam<double>.super_WithParamInterface<double>.
  _vptr_WithParamInterface =
       (_func_int **)&PTR__iu_TypeConversionParamTest_x_iutest_x_Test_Test_003905a0;
  return;
}

Assistant:

IUTEST_P(TypeConversionParamTest, Test)
{
}